

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::GetScheduleType_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ScheduleType);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetScheduleType() const
{
  return this->Impl->ScheduleType;
}